

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall
ImGuiIO::SetKeyEventNativeData
          (ImGuiIO *this,ImGuiKey key,int native_keycode,int native_scancode,int native_legacy_index
          )

{
  bool bVar1;
  ImGuiKey in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int legacy_key;
  ImGuiKey local_2c;
  
  if (in_ESI != 0) {
    local_2c = in_EDX;
    if (in_R8D != -1) {
      local_2c = in_R8D;
    }
    bVar1 = ImGui::IsLegacyKey(local_2c);
    if (bVar1) {
      *(int *)(in_RDI + 0xf0 + (long)local_2c * 4) = in_ESI;
      *(ImGuiKey *)(in_RDI + 0xf0 + (long)in_ESI * 4) = local_2c;
    }
  }
  return;
}

Assistant:

void ImGuiIO::SetKeyEventNativeData(ImGuiKey key, int native_keycode, int native_scancode, int native_legacy_index)
{
    if (key == ImGuiKey_None)
        return;
    IM_ASSERT(ImGui::IsNamedKey(key)); // >= 512
    IM_ASSERT(native_legacy_index == -1 || ImGui::IsLegacyKey(native_legacy_index)); // >= 0 && <= 511
    IM_UNUSED(native_keycode);  // Yet unused
    IM_UNUSED(native_scancode); // Yet unused

    // Build native->imgui map so old user code can still call key functions with native 0..511 values.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    const int legacy_key = (native_legacy_index != -1) ? native_legacy_index : native_keycode;
    if (!ImGui::IsLegacyKey(legacy_key))
        return;
    KeyMap[legacy_key] = key;
    KeyMap[key] = legacy_key;
#else
    IM_UNUSED(key);
    IM_UNUSED(native_legacy_index);
#endif
}